

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O2

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::LineInfo,_char> *jo)

{
  LineInfo *v;
  ostream *poVar1;
  JObject *pJVar2;
  JObject local_38;
  uint local_24;
  char local_1e [6];
  
  v = jo->object;
  local_38.sep = "";
  local_38.os = os;
  std::operator<<(os,"{ ");
  local_1e[0] = '\0';
  pJVar2 = JObject::field<char[16],bool,char>
                     (&local_38,(char (*) [16])"default_is_stmt",&v->default_is_stmt,local_1e);
  local_24 = (uint)v->opcode_base;
  local_1e[1] = 0;
  pJVar2 = JObject::field<char[12],int,char>
                     (pJVar2,(char (*) [12])"opcode_base",(int *)&local_24,local_1e + 1);
  local_1e[2] = 0;
  pJVar2 = JObject::field<char[15],std::vector<int,std::allocator<int>>,char>
                     (pJVar2,(char (*) [15])"opcode_lengths",&v->opcode_lengths,local_1e + 2);
  local_1e[3] = 0;
  pJVar2 = JObject::
           field<char[6],std::vector<pstack::Dwarf::FileEntry,std::allocator<pstack::Dwarf::FileEntry>>,char>
                     (pJVar2,(char (*) [6])"files",&v->files,local_1e + 3);
  local_1e[4] = 0;
  pJVar2 = JObject::
           field<char[12],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char>
                     (pJVar2,(char (*) [12])"directories",&v->directories,local_1e + 4);
  local_1e[5] = 0;
  pJVar2 = JObject::
           field<char[7],std::vector<pstack::Dwarf::LineState,std::allocator<pstack::Dwarf::LineState>>,char>
                     (pJVar2,(char (*) [7])"matrix",&v->matrix,local_1e + 5);
  poVar1 = pJVar2->os;
  JObject::~JObject(&local_38);
  return poVar1;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<Dwarf::LineInfo, C> &jo) {
    auto &lines = jo.object;
    return JObject(os)
        .field("default_is_stmt",  lines.default_is_stmt)
        .field("opcode_base", int(lines.opcode_base))
        .field("opcode_lengths", lines.opcode_lengths)
        .field("files", lines.files)
        .field("directories", lines.directories)
        .field("matrix", lines.matrix);
}